

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O1

void __thiscall
QPDFArgParser::Members::Members(Members *this,int argc,char **argv,char *progname_env)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  char *__s;
  unique_ptr<char[],_std::default_delete<char[]>_> tmp;
  allocator<char> local_89 [9];
  char *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  string *local_60;
  string local_50;
  
  this->argc = argc;
  this->argv = argv;
  local_60 = &this->whoami;
  local_68 = &(this->whoami).field_2;
  (this->whoami)._M_dataplus._M_p = (pointer)local_68;
  (this->whoami)._M_string_length = 0;
  (this->whoami).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->progname_env,progname_env,(allocator<char> *)&local_50);
  this->cur_arg = 0;
  this->bash_completion = false;
  this->zsh_completion = false;
  local_70 = &(this->bash_prev).field_2;
  (this->bash_prev)._M_dataplus._M_p = (pointer)local_70;
  (this->bash_prev)._M_string_length = 0;
  (this->bash_prev).field_2._M_local_buf[0] = '\0';
  local_78 = &(this->bash_cur).field_2;
  (this->bash_cur)._M_dataplus._M_p = (pointer)local_78;
  (this->bash_cur)._M_string_length = 0;
  (this->bash_cur).field_2._M_local_buf[0] = '\0';
  (this->bash_line)._M_dataplus._M_p = (pointer)&(this->bash_line).field_2;
  (this->bash_line)._M_string_length = 0;
  (this->bash_line).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->completions)._M_t._M_impl.super__Rb_tree_header;
  (this->completions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->completions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->completions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->completions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->completions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->option_tables)._M_t._M_impl.super__Rb_tree_header;
  (this->option_tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->option_tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->option_tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->option_tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->option_tables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->main_option_table)._M_t._M_impl.super__Rb_tree_header;
  (this->main_option_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->main_option_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->main_option_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->main_option_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->main_option_table)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->help_option_table)._M_t._M_impl.super__Rb_tree_header;
  (this->help_option_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->help_option_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->help_option_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->help_option_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->help_option_table)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->option_table = (option_table_t *)0x0;
  (this->option_table_name)._M_dataplus._M_p = (pointer)&(this->option_table_name).field_2;
  (this->option_table_name)._M_string_length = 0;
  (this->option_table_name).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->help_topics)._M_t._M_impl.super__Rb_tree_header;
  (this->help_topics)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->help_topics)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->bash_argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->bash_argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->bash_argv).
  super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bash_argv).
  super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->new_argv).
  super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bash_argv).
  super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->new_argv).
  super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->new_argv).
  super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->final_check_handler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->final_check_handler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->final_check_handler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->final_check_handler).super__Function_base._M_functor + 8) = 0;
  (this->help_topics)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->help_topics)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->help_topics)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->option_help)._M_t._M_impl.super__Rb_tree_header;
  (this->option_help)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->option_help)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->option_help)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->option_help)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->option_help)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->help_footer)._M_dataplus._M_p = (pointer)&(this->help_footer).field_2;
  (this->help_footer)._M_string_length = 0;
  (this->help_footer).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*argv,local_89);
  QUtil::make_unique_cstr((QUtil *)&local_80,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  __s = QUtil::getWhoami(local_80);
  pcVar2 = (char *)(this->whoami)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)local_60,0,pcVar2,(ulong)__s);
  if (local_80 != (char *)0x0) {
    operator_delete__(local_80);
  }
  return;
}

Assistant:

QPDFArgParser::Members::Members(int argc, char const* const argv[], char const* progname_env) :

    argc(argc),
    argv(argv),
    progname_env(progname_env),
    cur_arg(0),
    bash_completion(false),
    zsh_completion(false),
    option_table(nullptr),
    final_check_handler(nullptr)
{
    auto tmp = QUtil::make_unique_cstr(argv[0]);
    whoami = QUtil::getWhoami(tmp.get());
}